

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O3

Sampler * vkt::texture::util::createSampler
                    (Sampler *__return_storage_ptr__,WrapMode wrapU,WrapMode wrapV,
                    FilterMode minFilterMode,FilterMode magFilterMode)

{
  __return_storage_ptr__->wrapS = wrapU;
  __return_storage_ptr__->wrapT = wrapV;
  __return_storage_ptr__->wrapR = wrapU;
  __return_storage_ptr__->minFilter = minFilterMode;
  __return_storage_ptr__->magFilter = magFilterMode;
  __return_storage_ptr__->lodThreshold = 0.0;
  __return_storage_ptr__->normalizedCoords = true;
  __return_storage_ptr__->depthStencilMode = MODE_DEPTH;
  __return_storage_ptr__->compare = COMPAREMODE_NONE;
  __return_storage_ptr__->compareChannel = 0;
  *(undefined8 *)&(__return_storage_ptr__->borderColor).v = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->borderColor).v + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->borderColor).v + 9) = 0;
  return __return_storage_ptr__;
}

Assistant:

tcu::Sampler createSampler (tcu::Sampler::WrapMode wrapU, tcu::Sampler::WrapMode wrapV, tcu::Sampler::FilterMode minFilterMode, tcu::Sampler::FilterMode magFilterMode)
{
	return createSampler(wrapU, wrapV, wrapU, minFilterMode, magFilterMode);
}